

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcabs1.c
# Opt level: O1

doublereal dcabs1_(doublecomplex *z)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  
  dVar1 = z->r;
  dVar2 = z->i;
  uVar3 = -(ulong)(-dVar1 <= dVar1);
  uVar4 = -(ulong)(-dVar2 <= dVar2);
  return (double)(uVar4 & (ulong)dVar2 | ~uVar4 & (ulong)-dVar2) +
         (double)(uVar3 & (ulong)dVar1 | ~uVar3 & (ulong)-dVar1);
}

Assistant:

doublereal dcabs1_(doublecomplex *z)
{
/* >>Start of File<<   

       System generated locals */
    doublereal ret_val;
    doublecomplex equiv_0[1];

    /* Local variables */
#define t ((doublereal *)equiv_0)
#define zz (equiv_0)

    zz->r = z->r, zz->i = z->i;
    ret_val = abs(t[0]) + abs(t[1]);
    return ret_val;
}